

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::glog_internal_namespace_::InitGoogleLoggingUtilities(char *argv0)

{
  ostream *poVar1;
  LogMessage LStack_68;
  
  if (g_program_invocation_short_name == (char *)0x0) {
    g_program_invocation_short_name = const_basename(argv0);
    InstallFailureFunction(DumpStackTraceAndExit);
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/utilities.cc"
             ,0x12e);
  poVar1 = LogMessage::stream(&LStack_68);
  poVar1 = std::operator<<(poVar1,"Check failed: !IsGoogleLoggingInitialized() ");
  std::operator<<(poVar1,"You called InitGoogleLogging() twice!");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_68);
}

Assistant:

bool IsGoogleLoggingInitialized() {
  return g_program_invocation_short_name != nullptr;
}